

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

void map_free_all_(map_base_t *m)

{
  map_node_t **ppmVar1;
  uint uVar2;
  map_node_t *pmVar3;
  
  uVar2 = 0xffffffff;
  pmVar3 = (map_node_t *)0x0;
  do {
    if ((pmVar3 == (map_node_t *)0x0) || (pmVar3 = pmVar3->next, pmVar3 == (map_node_t *)0x0)) {
      do {
        uVar2 = uVar2 + 1;
        if (m->nbuckets <= uVar2) {
          return;
        }
        pmVar3 = m->buckets[uVar2];
      } while (pmVar3 == (map_node_t *)0x0);
    }
    ppmVar1 = map_getref(m,(char *)(pmVar3 + 1));
    if ((ppmVar1 != (map_node_t **)0x0) && ((undefined8 *)(*ppmVar1)->value != (undefined8 *)0x0)) {
      free(*(*ppmVar1)->value);
    }
  } while( true );
}

Assistant:

void map_free_all_(map_base_t *m) {
  const char *key;
  map_iter_t iter = map_iter(m);

  while ((key = map_next_(m, &iter))) {
    void **res = map_get_(m, key);
    if (res != NULL)
      free(*res);
  }
}